

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void __thiscall Image::Blit(Image *this,Image *src,Image *mask,int x,int y)

{
  bool bVar1;
  color_t cVar2;
  int iVar3;
  int iVar4;
  color_t local_36;
  color_t local_33;
  int local_30;
  int local_2c;
  int xx;
  int yy;
  int y_local;
  int x_local;
  Image *mask_local;
  Image *src_local;
  Image *this_local;
  
  xx = y;
  yy = x;
  _y_local = mask;
  mask_local = src;
  src_local = this;
  for (local_2c = 0; iVar4 = local_2c, iVar3 = GetHeight(mask_local), iVar4 < iVar3;
      local_2c = local_2c + 1) {
    for (local_30 = 0; iVar4 = local_30, iVar3 = GetWidth(mask_local), iVar4 < iVar3;
        local_30 = local_30 + 1) {
      cVar2 = Get(_y_local,local_30,local_2c);
      local_33._0_2_ = cVar2._0_2_;
      local_33.b = cVar2.b;
      bVar1 = operator==(&local_33,&color_black);
      if (bVar1) {
        iVar4 = local_30 + yy;
        iVar3 = local_2c + xx;
        cVar2 = Get(mask_local,local_30,local_2c);
        local_36._0_2_ = cVar2._0_2_;
        local_36.b = cVar2.b;
        Set(this,iVar4,iVar3,&local_36);
      }
    }
  }
  return;
}

Assistant:

void Image::Blit(Image const& src, Image const& mask, int x, int y) {
  for (auto yy = 0; yy < src.GetHeight(); ++yy) {
    for (auto xx = 0; xx < src.GetWidth(); ++xx) {
      if (mask.Get(xx, yy) == color_black) {
        Set(xx + x, yy + y, src.Get(xx, yy));
      }
    }
  }
}